

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_perform_rcpt_to(Curl_easy *data)

{
  connectdata *pcVar1;
  char *pcVar2;
  CURLcode CVar3;
  anon_union_280_10_9f9d5394_for_proto *pp;
  char *address;
  hostname host;
  char *local_50;
  hostname local_48;
  
  pcVar1 = data->conn;
  local_50 = (char *)0x0;
  local_48.name = (char *)0x0;
  local_48.dispname = (char *)0x0;
  local_48.rawalloc = (char *)0x0;
  local_48.encalloc = (char *)0x0;
  CVar3 = smtp_parse_address(((data->req).p.smtp)->rcpt->data,&local_50,&local_48);
  pcVar2 = local_50;
  if (CVar3 == CURLE_OK) {
    pp = &pcVar1->proto;
    if (local_48.name == (char *)0x0) {
      CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"RCPT TO:<%s>",local_50);
    }
    else {
      CVar3 = Curl_pp_sendf(data,&(pp->ftpc).pp,"RCPT TO:<%s@%s>",local_50);
    }
    (*Curl_cfree)(pcVar2);
    if (CVar3 == CURLE_OK) {
      smtp_state(data,SMTP_RCPT);
      CVar3 = CURLE_OK;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode smtp_perform_rcpt_to(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct SMTP *smtp = data->req.p.smtp;
  char *address = NULL;
  struct hostname host = { NULL, NULL, NULL, NULL };

  /* Parse the recipient mailbox into the local address and hostname parts,
     converting the hostname to an IDN A-label if necessary */
  result = smtp_parse_address(smtp->rcpt->data,
                              &address, &host);
  if(result)
    return result;

  /* Send the RCPT TO command */
  if(host.name)
    result = Curl_pp_sendf(data, &conn->proto.smtpc.pp, "RCPT TO:<%s@%s>",
                           address, host.name);
  else
    /* An invalid mailbox was provided but we will simply let the server worry
       about that and reply with a 501 error */
    result = Curl_pp_sendf(data, &conn->proto.smtpc.pp, "RCPT TO:<%s>",
                           address);

  Curl_free_idnconverted_hostname(&host);
  free(address);

  if(!result)
    smtp_state(data, SMTP_RCPT);

  return result;
}